

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O0

string * adios2::ToString_abi_cxx11_(DataType type)

{
  undefined4 in_ESI;
  string *in_RDI;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
  default:
    std::__cxx11::string::string((string *)in_RDI);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int8_t",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int16_t",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int32_t",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"int64_t",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint8_t",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint16_t",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint32_t",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"uint64_t",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"float",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xb:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"long double",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 0xc:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"float complex",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"double complex",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    break;
  case 0xe:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"string",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
    break;
  case 0xf:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"char",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 0x10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"struct",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  return in_RDI;
}

Assistant:

std::string ToString(DataType type)
{
    // Keep in sync with helper::GetDataTypeFromString
    switch (type)
    {
    case DataType::None:
        break;
    case DataType::Char:
        return "char";
    case DataType::Int8:
        return "int8_t";
    case DataType::Int16:
        return "int16_t";
    case DataType::Int32:
        return "int32_t";
    case DataType::Int64:
        return "int64_t";
    case DataType::UInt8:
        return "uint8_t";
    case DataType::UInt16:
        return "uint16_t";
    case DataType::UInt32:
        return "uint32_t";
    case DataType::UInt64:
        return "uint64_t";
    case DataType::Float:
        return "float";
    case DataType::Double:
        return "double";
    case DataType::LongDouble:
        return "long double";
    case DataType::FloatComplex:
        return "float complex";
    case DataType::DoubleComplex:
        return "double complex";
    case DataType::String:
        return "string";
    case DataType::Struct:
        return "struct";
    }
    return std::string();
}